

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void parse_type(fb_parser_t *P,fb_value_t *v)

{
  long lVar1;
  int iVar2;
  unsigned_short uVar3;
  fb_token_t *pfVar4;
  fb_token_t *pfVar5;
  fb_token_t *pfVar6;
  int local_34;
  int vector;
  fb_token_t *t0;
  fb_token_t *ttype;
  fb_token_t *t;
  fb_value_t *v_local;
  fb_parser_t *P_local;
  
  pfVar6 = P->token;
  local_34 = 0;
  v->len = 1;
  v->type = 1;
  while (pfVar4 = optional(P,0x5b), pfVar4 != (fb_token_t *)0x0) {
    local_34 = local_34 + 1;
  }
  if (1 < local_34) {
    error_tok(P,pfVar6,"vector type can only be one-dimensional");
  }
  pfVar4 = P->token;
  lVar1 = pfVar4->id;
  if ((((2 < lVar1 + 999U) && (7 < lVar1 + 0x3e3U)) && (lVar1 != -0x3d9)) &&
     (((1 < lVar1 + 0x3d7U && (5 < lVar1 + 0x3d4U)) && (lVar1 != -0x3cd)))) {
    if (lVar1 == -0x3cc) {
      (v->field_0).s.s = (char *)P->token;
      uVar3 = 0xb;
      if (local_34 != 0) {
        uVar3 = 10;
      }
      v->type = uVar3;
      next(P);
      goto LAB_001311ae;
    }
    if (lVar1 != -0x3ca) {
      if (lVar1 == 9) {
        parse_ref(P,(fb_ref_t **)v);
        uVar3 = 0xd;
        if (local_34 != 0) {
          uVar3 = 0xc;
        }
        v->type = uVar3;
      }
      else if (lVar1 == 0x5d) {
        error_tok(P,(fb_token_t *)0x0,"vector type cannot be empty");
      }
      else {
        error_tok(P,pfVar4,"invalid type specifier");
      }
      goto LAB_001311ae;
    }
  }
  (v->field_0).s.s = (char *)P->token;
  uVar3 = 9;
  if (local_34 != 0) {
    uVar3 = 8;
  }
  v->type = uVar3;
  next(P);
LAB_001311ae:
  if ((local_34 != 0) && (pfVar5 = optional(P,0x3a), pfVar5 != (fb_token_t *)0x0)) {
    parse_fixed_array_size(P,pfVar4,v);
  }
  do {
    iVar2 = local_34;
    pfVar5 = optional(P,0x5d);
    if (pfVar5 != (fb_token_t *)0x0) {
      local_34 = local_34 + -1;
    }
  } while (pfVar5 != (fb_token_t *)0x0 && iVar2 != 0);
  if (local_34 != 0) {
    error_tok_2(P,(fb_token_t *)0x0,"vector type missing \']\' to match",pfVar6);
  }
  pfVar5 = optional(P,0x5d);
  if (pfVar5 != (fb_token_t *)0x0) {
    error_tok_2(P,pfVar5,"extra \']\' not matching",pfVar6);
    do {
      pfVar6 = optional(P,0x5d);
    } while (pfVar6 != (fb_token_t *)0x0);
  }
  if (((pfVar4->id == -0x3e5) && (v->type != 1)) && (v->type != 0x11)) {
    error_tok(P,pfVar4,"char can only be used as a fixed length array type [char:<n>]");
    v->type = 1;
  }
  return;
}

Assistant:

static void parse_type(fb_parser_t *P, fb_value_t *v)
{
    fb_token_t *t = 0;
    fb_token_t *ttype = 0;
    fb_token_t *t0 = P->token;
    int vector = 0;

    v->len = 1;
    v->type = vt_invalid;
    while ((t = optional(P, '['))) {
        ++vector;
    }
    if (vector > 1) {
        error_tok(P, t0, "vector type can only be one-dimensional");
    }
    ttype = P->token;
    switch (ttype->id) {
    case tok_kw_int:
    case tok_kw_bool:
    case tok_kw_byte:
    case tok_kw_long:
    case tok_kw_uint:
    case tok_kw_float:
    case tok_kw_short:
    case tok_kw_char:
    case tok_kw_ubyte:
    case tok_kw_ulong:
    case tok_kw_ushort:
    case tok_kw_double:
    case tok_kw_int8:
    case tok_kw_int16:
    case tok_kw_int32:
    case tok_kw_int64:
    case tok_kw_uint8:
    case tok_kw_uint16:
    case tok_kw_uint32:
    case tok_kw_uint64:
    case tok_kw_float32:
    case tok_kw_float64:
        v->t = P->token;
        v->type = vector ? vt_vector_type : vt_scalar_type;
        next(P);
        break;
    case tok_kw_string:
        v->t = P->token;
        v->type = vector ? vt_vector_string_type : vt_string_type;
        next(P);
        break;
    case LEX_TOK_ID:
        parse_ref(P, &v->ref);
        v->type = vector ? vt_vector_type_ref : vt_type_ref;
        break;
    case ']':
        error_tok(P, t, "vector type cannot be empty");
        break;
    default:
        error_tok(P, ttype, "invalid type specifier");
        break;
    }
    if (vector && optional(P, ':')) {
        parse_fixed_array_size(P, ttype, v);
    }
    while (optional(P, ']') && vector--) {
    }
    if (vector) {
        error_tok_2(P, t, "vector type missing ']' to match", t0);
    }
    if ((t = optional(P, ']'))) {
        error_tok_2(P, t, "extra ']' not matching", t0);
        while (optional(P, ']')) {
        }
    }
    if (ttype->id == tok_kw_char && v->type != vt_invalid) {
        if (v->type != vt_fixed_array_type) {
            error_tok(P, ttype, "char can only be used as a fixed length array type [char:<n>]");
            v->type = vt_invalid;
        }
    }
}